

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> * __thiscall
testing::internal::
OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::GetAction
          (OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *local_10;
  OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this_local;
  
  iVar1 = *(int *)(this + 0xc);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_30,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_31);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *)
         (this + 0x58);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }